

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O0

Aig_Man_t *
Aig_ManScl(Aig_Man_t *pAig,int fLatchConst,int fLatchEqual,int fUseMvSweep,int nFramesSymb,
          int nFramesSatur,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *local_80;
  int nTruePis;
  int Entry2;
  int Entry1;
  int i;
  Aig_Obj_t *pFlop2;
  Aig_Obj_t *pFlop1;
  Aig_Man_t *pAigNew;
  Aig_Man_t *pAigInit;
  int nFramesSatur_local;
  int nFramesSymb_local;
  int fUseMvSweep_local;
  int fLatchEqual_local;
  int fLatchConst_local;
  Aig_Man_t *pAig_local;
  
  if ((pAig->vClockDoms == (Vec_Vec_t *)0x0) || (iVar1 = Vec_VecSize(pAig->vClockDoms), iVar1 < 1))
  {
    if (pAig->vFlopNums != (Vec_Int_t *)0x0) {
      __assert_fail("pAig->vFlopNums == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                    ,0x297,"Aig_Man_t *Aig_ManScl(Aig_Man_t *, int, int, int, int, int, int, int)");
    }
    _fLatchEqual_local = Aig_ManDupSimple(pAig);
    pVVar5 = Vec_IntStartNatural(_fLatchEqual_local->nRegs);
    _fLatchEqual_local->vFlopNums = pVVar5;
    pVVar5 = Vec_IntAlloc(100);
    _fLatchEqual_local->vFlopReprs = pVVar5;
    Aig_ManSeqCleanup(_fLatchEqual_local);
    if ((fLatchConst != 0) && (_fLatchEqual_local->nRegs != 0)) {
      _fLatchEqual_local =
           Aig_ManConstReduce(_fLatchEqual_local,fUseMvSweep,nFramesSymb,nFramesSatur,fVerbose,
                              fVeryVerbose);
    }
    if ((fLatchEqual != 0) && (_fLatchEqual_local->nRegs != 0)) {
      _fLatchEqual_local = Aig_ManReduceLaches(_fLatchEqual_local,fVerbose);
    }
    iVar1 = Aig_ManCiNum(pAig);
    iVar2 = Aig_ManRegNum(pAig);
    iVar3 = Aig_ManObjNumMax(pAig);
    Aig_ManReprStart(pAig,iVar3);
    for (Entry2 = 0; iVar3 = Vec_IntSize(_fLatchEqual_local->vFlopReprs), Entry2 < iVar3;
        Entry2 = Entry2 + 2) {
      iVar3 = Vec_IntEntry(_fLatchEqual_local->vFlopReprs,Entry2);
      iVar4 = Vec_IntEntry(_fLatchEqual_local->vFlopReprs,Entry2 + 1);
      pAVar6 = Aig_ManCi(pAig,(iVar1 - iVar2) + iVar3);
      if (iVar4 == -1) {
        local_80 = Aig_ManConst1(pAig);
      }
      else {
        local_80 = Aig_ManCi(pAig,(iVar1 - iVar2) + iVar4);
      }
      if (pAVar6 == local_80) {
        __assert_fail("pFlop1 != pFlop2",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigScl.c"
                      ,0x2aa,"Aig_Man_t *Aig_ManScl(Aig_Man_t *, int, int, int, int, int, int, int)"
                     );
      }
      if (local_80->Id < pAVar6->Id) {
        pAig->pReprs[pAVar6->Id] = local_80;
      }
      else {
        pAig->pReprs[local_80->Id] = pAVar6;
      }
    }
    Aig_ManStop(_fLatchEqual_local);
    pAig_local = Aig_ManDupRepr(pAig,0);
    Aig_ManSeqCleanup(pAig_local);
    Aig_ManRegNum(pAig_local);
  }
  else {
    pAig_local = Aig_ManSclPart(pAig,fLatchConst,fLatchEqual,fVerbose);
  }
  return pAig_local;
}

Assistant:

Aig_Man_t * Aig_ManScl( Aig_Man_t * pAig, int fLatchConst, int fLatchEqual, int fUseMvSweep, int nFramesSymb, int nFramesSatur, int fVerbose, int fVeryVerbose )
{
    extern void Saig_ManReportUselessRegisters( Aig_Man_t * pAig );
    extern int Saig_ManReportComplements( Aig_Man_t * p );

    Aig_Man_t * pAigInit, * pAigNew;
    Aig_Obj_t * pFlop1, * pFlop2;
    int i, Entry1, Entry2, nTruePis;//, nRegs;

    if ( pAig->vClockDoms && Vec_VecSize(pAig->vClockDoms) > 0 )
        return Aig_ManSclPart( pAig, fLatchConst, fLatchEqual, fVerbose);

    // store the original AIG
    assert( pAig->vFlopNums == NULL );
    pAigInit = pAig;
    pAig = Aig_ManDupSimple( pAig );
    // create storage for latch numbers
    pAig->vFlopNums = Vec_IntStartNatural( pAig->nRegs );
    pAig->vFlopReprs = Vec_IntAlloc( 100 );
    Aig_ManSeqCleanup( pAig );
    if ( fLatchConst && pAig->nRegs )
        pAig = Aig_ManConstReduce( pAig, fUseMvSweep, nFramesSymb, nFramesSatur, fVerbose, fVeryVerbose );
    if ( fLatchEqual && pAig->nRegs )
        pAig = Aig_ManReduceLaches( pAig, fVerbose );
    // translate pairs into reprs
    nTruePis = Aig_ManCiNum(pAigInit)-Aig_ManRegNum(pAigInit);
    Aig_ManReprStart( pAigInit, Aig_ManObjNumMax(pAigInit) );
    Vec_IntForEachEntry( pAig->vFlopReprs, Entry1, i )
    {
        Entry2 = Vec_IntEntry( pAig->vFlopReprs, ++i ); 
        pFlop1 = Aig_ManCi( pAigInit, nTruePis + Entry1 );
        pFlop2 = (Entry2 == -1)? Aig_ManConst1(pAigInit) : Aig_ManCi( pAigInit, nTruePis + Entry2 );
        assert( pFlop1 != pFlop2 );
        if ( pFlop1->Id > pFlop2->Id )
            pAigInit->pReprs[pFlop1->Id] = pFlop2;
        else
            pAigInit->pReprs[pFlop2->Id] = pFlop1;
    }
    Aig_ManStop( pAig );
//    Aig_ManSeqCleanup( pAigInit );
    pAigNew = Aig_ManDupRepr( pAigInit, 0 );
    Aig_ManSeqCleanup( pAigNew );

//    Saig_ManReportUselessRegisters( pAigNew );
    if ( Aig_ManRegNum(pAigNew) == 0 )
        return pAigNew;
//    nRegs = Saig_ManReportComplements( pAigNew );
//    if ( nRegs ) 
//    printf( "The number of complemented registers = %d.\n", nRegs );
    return pAigNew;
}